

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Model::set_allocated_featurevectorizer
          (Model *this,FeatureVectorizer *featurevectorizer)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (featurevectorizer != (FeatureVectorizer *)0x0) {
    uVar1 = (featurevectorizer->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      featurevectorizer =
           (FeatureVectorizer *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&featurevectorizer->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x25a;
    (this->Type_).featurevectorizer_ = featurevectorizer;
  }
  return;
}

Assistant:

void Model::set_allocated_featurevectorizer(::CoreML::Specification::FeatureVectorizer* featurevectorizer) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (featurevectorizer) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(featurevectorizer));
    if (message_arena != submessage_arena) {
      featurevectorizer = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, featurevectorizer, submessage_arena);
    }
    set_has_featurevectorizer();
    Type_.featurevectorizer_ = featurevectorizer;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.featureVectorizer)
}